

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::SwiftCompilerShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llvm::StringRef)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  BuildSystemDelegate *pBVar1;
  undefined8 uVar2;
  BuildSystemImpl *pBVar3;
  TaskInterface in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  StringRef local_a0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0.Length = message.Length;
  local_a0.Data = message.Data;
  pBVar3 = anon_unknown.dwarf_16ac71::getBuildSystem(in_stack_ffffffffffffff18);
  pBVar1 = pBVar3->delegate;
  uVar2 = *(undefined8 *)((long)this + 0x28);
  llvm::StringRef::str_abi_cxx11_
            ((string *)&stack0xffffffffffffff20,(StringRef *)((long)this + 0x18));
  std::operator+(&local_c0,"error reading dependency file \'",(string *)&stack0xffffffffffffff20);
  std::operator+(&local_70,&local_c0,"\': ");
  llvm::StringRef::str_abi_cxx11_(&local_90,&local_a0);
  std::operator+(&local_50,&local_70,&local_90);
  (*pBVar1->_vptr_BuildSystemDelegate[0xb])
            (pBVar1,uVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(int *)((long)this + 0x30) = *(int *)((long)this + 0x30) + 1;
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
        getBuildSystem(ti).getDelegate().commandHadError(command,
                       "error reading dependency file '" + depsPath.str() +
                       "': " + message.str());
        ++numErrors;
      }